

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O1

void __thiscall wasm::JSPI::run(JSPI *this,Module *module)

{
  Module *pMVar1;
  size_type *psVar2;
  int iVar3;
  uintptr_t uVar4;
  char *pcVar5;
  ElementSegment *pEVar6;
  Expression *pEVar7;
  ulong __code;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  pointer puVar10;
  size_t sVar11;
  char *pcVar12;
  HeapType type;
  pointer pbVar13;
  pointer ppFVar14;
  bool bVar15;
  long *plVar16;
  undefined8 *puVar17;
  RefNull *pRVar18;
  Function *pFVar19;
  __node_base_ptr p_Var20;
  _Hash_node_base *p_Var21;
  string_view *psVar22;
  pointer ppEVar23;
  RefFunc *this_00;
  undefined1 reuse;
  string *psVar24;
  Function *pFVar25;
  size_type *psVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stateChanger;
  pointer puVar27;
  ulong uVar28;
  undefined8 uVar29;
  pointer puVar30;
  _Head_base<0UL,_wasm::Function_*,_false> _Var31;
  string_view *psVar32;
  ulong uVar33;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar34;
  bool bVar35;
  string_view sVar36;
  Name name;
  undefined1 local_230 [8];
  Split listedExports;
  string stateChangingImports;
  Split listedImports;
  string stateChangingExports;
  string *local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  HeapType local_170;
  string local_168;
  Builder local_148;
  Builder builder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  pointer local_120;
  string_view local_118;
  _Head_base<0UL,_wasm::Function_*,_false> _Stack_108;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  undefined1 auStack_d8 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  wrappedExports;
  ulong local_98;
  __node_base local_90 [2];
  undefined1 local_80 [32];
  Module *local_60;
  string local_58;
  byte local_31;
  
  wrappedExports._M_h._M_single_bucket = local_90;
  local_148.wasm = module;
  local_60 = module;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wrappedExports._M_h._M_single_bucket,"jspi-imports","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  Pass::getArgumentOrDefault
            ((string *)local_80,&this->super_Pass,(string *)&wrappedExports._M_h._M_single_bucket,
             &local_58);
  read_possible_response_file((string *)auStack_d8,(string *)local_80);
  String::trim((string *)&listedExports.needToHandleBracketingOperations,(string *)auStack_d8);
  psVar2 = &wrappedExports._M_h._M_bucket_count;
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  pFVar19 = (Function *)(local_80 + 0x10);
  if ((Function *)local_80._0_8_ != pFVar19) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (wrappedExports._M_h._M_single_bucket != local_90) {
    operator_delete(wrappedExports._M_h._M_single_bucket,
                    (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
  }
  auStack_d8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,",","");
  String::Split::Split
            ((Split *)((long)&stateChangingImports.field_2 + 8),
             (string *)&listedExports.needToHandleBracketingOperations,(string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  wrappedExports._M_h._M_single_bucket = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wrappedExports._M_h._M_single_bucket,"jspi-exports","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  psVar24 = &local_58;
  Pass::getArgumentOrDefault
            ((string *)local_80,&this->super_Pass,(string *)&wrappedExports._M_h._M_single_bucket,
             psVar24);
  reuse = SUB81(psVar24,0);
  read_possible_response_file((string *)auStack_d8,(string *)local_80);
  String::trim((string *)&listedImports.needToHandleBracketingOperations,(string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  if ((Function *)local_80._0_8_ != pFVar19) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (wrappedExports._M_h._M_single_bucket != local_90) {
    operator_delete(wrappedExports._M_h._M_single_bucket,
                    (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
  }
  auStack_d8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,",","");
  String::Split::Split
            ((Split *)local_230,(string *)&listedImports.needToHandleBracketingOperations,
             (string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  auStack_d8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,"jspi-split-module","");
  bVar15 = Pass::hasArgument(&this->super_Pass,(string *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  type.id = DAT_010d1fe0.id;
  pcVar5 = ModuleSplitting::LOAD_SECONDARY_MODULE;
  if (!bVar15) goto LAB_00924fa3;
  HeapType::HeapType(&local_170,(Signature)ZEXT816(0));
  auStack_d8 = (undefined1  [8])0x0;
  wrappedExports._M_h._M_buckets = (__buckets_ptr)0x0;
  wrappedExports._M_h._M_bucket_count = 0;
  name.super_IString.str._M_str = pcVar5;
  name.super_IString.str._M_len = (size_t)&_Stack_108;
  Builder::makeFunction
            (name,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_170.id,
             (Expression *)auStack_d8);
  if (auStack_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count - (long)auStack_d8);
  }
  pcVar5 = DAT_010d1118;
  ((_Stack_108._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
  ((_Stack_108._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar5;
  pcVar5 = (char *)DAT_010d1fe0.id;
  ((_Stack_108._M_head_impl)->super_Importable).base.super_IString.str._M_len =
       (size_t)ModuleSplitting::LOAD_SECONDARY_MODULE;
  ((_Stack_108._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar5;
  Module::addFunction(local_60,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &_Stack_108);
  wrappedExports._M_h._M_single_bucket = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wrappedExports._M_h._M_single_bucket,DAT_010d1118,DAT_010d1118 + ENV);
  plVar16 = (long *)std::__cxx11::string::append((char *)&wrappedExports._M_h._M_single_bucket);
  pFVar25 = (Function *)(plVar16 + 2);
  if ((Function *)*plVar16 == pFVar25) {
    local_80._16_8_ = (pFVar25->super_Importable).super_Named.name.super_IString.str._M_len;
    local_80._24_4_ = (undefined4)plVar16[3];
    local_80._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_80._0_8_ = pFVar19;
  }
  else {
    local_80._16_8_ = (pFVar25->super_Importable).super_Named.name.super_IString.str._M_len;
    local_80._0_8_ = (Function *)*plVar16;
  }
  local_80._8_8_ = plVar16[1];
  *plVar16 = (long)pFVar25;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,DAT_010d1fe0.id,
             ModuleSplitting::LOAD_SECONDARY_MODULE + DAT_010d1fe0.id);
  uVar28 = 0xf;
  if ((Function *)local_80._0_8_ != pFVar19) {
    uVar28 = local_80._16_8_;
  }
  if (uVar28 < local_58._M_string_length + local_80._8_8_) {
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar29 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_58._M_string_length + local_80._8_8_) goto LAB_00924ea5;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,local_80._0_8_);
  }
  else {
LAB_00924ea5:
    puVar17 = (undefined8 *)
              std::__cxx11::string::_M_append(local_80,(ulong)local_58._M_dataplus._M_p);
  }
  psVar26 = puVar17 + 2;
  if ((size_type *)*puVar17 == psVar26) {
    wrappedExports._M_h._M_bucket_count = *psVar26;
    wrappedExports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)puVar17[3];
    auStack_d8 = (undefined1  [8])psVar2;
  }
  else {
    wrappedExports._M_h._M_bucket_count = *psVar26;
    auStack_d8 = (undefined1  [8])*puVar17;
  }
  wrappedExports._M_h._M_buckets = (__buckets_ptr)puVar17[1];
  *puVar17 = psVar26;
  puVar17[1] = 0;
  *(undefined1 *)psVar26 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             (stateChangingImports.field_2._M_local_buf + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8);
  reuse = SUB81(psVar26,0);
  if (auStack_d8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_d8,wrappedExports._M_h._M_bucket_count + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((Function *)local_80._0_8_ != pFVar19) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (wrappedExports._M_h._M_single_bucket != local_90) {
    operator_delete(wrappedExports._M_h._M_single_bucket,
                    (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
  }
  if (_Stack_108._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&_Stack_108,_Stack_108._M_head_impl);
  }
LAB_00924fa3:
  local_31 = bVar15;
  sVar36 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xe044a0),(bool)reuse);
  local_118 = (string_view)Names::getValidGlobalName(local_60,(Name)sVar36);
  uVar4 = (this->externref).id;
  pRVar18 = Builder::makeRefNull(&local_148,(HeapType)0x60);
  auStack_d8 = (undefined1  [8])operator_new(0x50);
  *(size_t *)((long)auStack_d8 + 0x40) = 0;
  *(size_t *)((long)auStack_d8 + 0x48) = 0;
  *(size_t *)((long)auStack_d8 + 0x30) = 0;
  *(size_t *)((long)auStack_d8 + 0x38) = 0;
  *(size_t *)((long)auStack_d8 + 0x20) = 0;
  *(size_t *)((long)auStack_d8 + 0x28) = 0;
  *(size_t *)((long)auStack_d8 + 0x10) = 0;
  *(size_t *)((long)auStack_d8 + 0x18) = 0;
  *(size_t *)auStack_d8 = 0;
  *(size_t *)((long)auStack_d8 + 8) = 0;
  *(size_t *)auStack_d8 = local_118._M_len;
  *(char **)((long)auStack_d8 + 8) = local_118._M_str;
  *(uintptr_t *)((long)auStack_d8 + 0x38) = uVar4;
  *(RefNull **)((long)auStack_d8 + 0x40) = pRVar18;
  *(undefined1 *)((long)auStack_d8 + 0x48) = 1;
  Module::addGlobal(local_60,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                             auStack_d8);
  if (auStack_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_d8,0x50);
  }
  auStack_d8 = (undefined1  [8])&wrappedExports._M_h._M_rehash_policy._M_next_resize;
  wrappedExports._M_h._M_buckets = (__buckets_ptr)0x1;
  wrappedExports._M_h._M_bucket_count = 0;
  wrappedExports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  wrappedExports._M_h._M_element_count._0_4_ = 0x3f800000;
  wrappedExports._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  wrappedExports._M_h._M_rehash_policy._4_4_ = 0;
  wrappedExports._M_h._M_rehash_policy._M_next_resize = 0;
  puVar30 = (local_60->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(local_60->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar30 !=
      (pointer)originalFunctions.
               super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
    do {
      pFVar19 = (Function *)
                (puVar30->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      iVar3 = *(int *)((long)&pFVar19->super_Importable + 0x10);
      if (iVar3 == 0) {
        pcVar5 = *(char **)((long)&(pFVar19->super_Importable).super_Named + 8);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,pcVar5,
                   pcVar5 + *(long *)&(pFVar19->super_Importable).super_Named);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&stateChangingExports.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_230);
        bVar15 = (string *)stateChangingExports.field_2._8_8_ != local_1a8;
        uVar29 = stateChangingExports.field_2._8_8_;
        bVar35 = true;
        while ((bVar15 && (bVar15 = String::wildcardMatch((string *)uVar29,&local_168), !bVar15))) {
          uVar29 = uVar29 + 0x20;
          bVar15 = (string *)uVar29 != local_1a8;
          bVar35 = bVar15;
        }
      }
      else {
        bVar35 = false;
      }
      if ((iVar3 == 0) &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&stateChangingExports.field_2 + 8)),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_168._M_dataplus._M_p != &local_168.field_2)) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if (bVar35) {
        pFVar19 = (Function *)
                  (puVar30->_M_t).
                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        psVar32 = (string_view *)((long)&pFVar19->super_Importable + 0x18);
        if (*(char *)&((Name *)((long)&pFVar19->super_Importable + 0x28))->super_IString != '\0') {
          psVar32 = (string_view *)0x0;
        }
        pFVar19 = Module::getFunction(local_60,(Name)*psVar32);
        pcVar5 = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str;
        p_Var20 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)auStack_d8,(ulong)pcVar5 % (ulong)wrappedExports._M_h._M_buckets,
                             (key_type *)pFVar19,(__hash_code)pcVar5);
        if (p_Var20 == (__node_base_ptr)0x0) {
          p_Var21 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var21 = p_Var20->_M_nxt;
        }
        if (p_Var21 == (_Hash_node_base *)0x0) {
          sVar36 = (string_view)makeWrapperForExport(this,pFVar19,local_60,(Name)local_118);
          psVar22 = (string_view *)
                    std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_d8,(key_type *)pFVar19);
          *psVar22 = sVar36;
        }
        else {
          sVar36 = *(string_view *)(p_Var21 + 3);
        }
        *psVar32 = sVar36;
      }
      puVar30 = puVar30 + 1;
    } while (puVar30 !=
             (pointer)originalFunctions.
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  puVar27 = (local_60->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_120 = (local_60->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar27 != local_120) {
    do {
      bVar15 = wasm::Type::isFunction
                         (&((puVar27->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                           type);
      if ((bVar15) &&
         (pEVar6 = (puVar27->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,
         ppEVar23 = *(pointer *)
                     &(pEVar6->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl,
         *(pointer *)
          ((long)&(pEVar6->data).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> + 8)
         != ppEVar23)) {
        uVar28 = 0;
        uVar33 = 1;
        do {
          pEVar7 = ppEVar23[uVar28];
          if (pEVar7->_id == RefFuncId) {
            __code = pEVar7[1].type.id;
            p_Var20 = std::
                      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::_M_find_before_node
                                ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  *)auStack_d8,__code % (ulong)wrappedExports._M_h._M_buckets,
                                 (key_type *)(pEVar7 + 1),__code);
            if (p_Var20 == (__node_base_ptr)0x0) {
              p_Var21 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var21 = p_Var20->_M_nxt;
            }
            if (p_Var21 != (_Hash_node_base *)0x0) {
              p_Var8 = p_Var21[3]._M_nxt;
              p_Var9 = p_Var21[4]._M_nxt;
              pFVar19 = Module::getFunction(local_60,(IString)*(IString *)&p_Var21[3]._M_nxt);
              originalFunctions.
              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)(pFVar19->type).id;
              this_00 = (RefFunc *)MixedArena::allocSpace(&(local_148.wasm)->allocator,0x20,8);
              (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id =
                   RefFuncId;
              (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id
                   = 0;
              (this_00->func).super_IString.str._M_len = 0;
              (this_00->func).super_IString.str._M_len = (size_t)p_Var8;
              (this_00->func).super_IString.str._M_str = (char *)p_Var9;
              RefFunc::finalize(this_00,(HeapType)
                                        originalFunctions.
                                        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
              *(RefFunc **)
               (*(long *)&(((puVar27->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl + uVar28 * 8) = this_00;
            }
          }
          pEVar6 = (puVar27->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
          ppEVar23 = *(pointer *)
                      &(pEVar6->data).
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl;
          bVar15 = uVar33 < (ulong)((long)*(pointer *)
                                           ((long)&(pEVar6->data).
                                                                                                      
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           + 8) - (long)ppEVar23 >> 3);
          uVar28 = uVar33;
          uVar33 = (ulong)((int)uVar33 + 1);
        } while (bVar15);
      }
      puVar27 = puVar27 + 1;
    } while (puVar27 != local_120);
  }
  _Stack_108._M_head_impl = (Function *)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar34 = (local_60->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (local_60->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar34 != puVar10) {
    do {
      local_80._0_8_ =
           (puVar34->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&_Stack_108,
                 (Function **)local_80);
      puVar34 = puVar34 + 1;
    } while (puVar34 != puVar10);
  }
  ppFVar14 = originalFunctions.
             super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (_Stack_108._M_head_impl !=
      (Function *)
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_120 = (pointer)CONCAT44(local_120._4_4_,(uint)local_31);
    _Var31._M_head_impl = _Stack_108._M_head_impl;
    do {
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((_Var31._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                    _M_len;
      pcVar5 = (((Function *)
                originalFunctions.
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)->super_Importable).module.super_IString.
               str._M_str;
      if (pcVar5 == (char *)0x0) {
        bVar15 = false;
      }
      else {
        sVar11 = (((Function *)
                  originalFunctions.
                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)->super_Importable).base.super_IString.
                 str._M_len;
        pcVar12 = (((Function *)
                   originalFunctions.
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->super_Importable).base.super_IString.
                  str._M_str;
        wrappedExports._M_h._M_single_bucket = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&wrappedExports._M_h._M_single_bucket,pcVar5,
                   pcVar5 + (((Function *)
                             originalFunctions.
                             super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_Importable).
                            module.super_IString.str._M_len);
        plVar16 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)&wrappedExports._M_h._M_single_bucket,local_98,0,'\x01')
        ;
        local_80._0_8_ = local_80 + 0x10;
        pFVar19 = (Function *)(plVar16 + 2);
        if ((Function *)*plVar16 == pFVar19) {
          local_80._16_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
          local_80._24_4_ = (undefined4)plVar16[3];
          local_80._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
        }
        else {
          local_80._16_8_ = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
          local_80._0_8_ = (Function *)*plVar16;
        }
        local_80._8_8_ = plVar16[1];
        *plVar16 = (long)pFVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,pcVar12,pcVar12 + sVar11);
        uVar28 = 0xf;
        if ((Function *)local_80._0_8_ != (Function *)(local_80 + 0x10)) {
          uVar28 = local_80._16_8_;
        }
        if (uVar28 < local_58._M_string_length + local_80._8_8_) {
          uVar29 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            uVar29 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < local_58._M_string_length + local_80._8_8_) goto LAB_009254ff;
          plVar16 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_58,0,(char *)0x0,local_80._0_8_);
        }
        else {
LAB_009254ff:
          plVar16 = (long *)std::__cxx11::string::_M_append
                                      (local_80,(ulong)local_58._M_dataplus._M_p);
        }
        pMVar1 = (Module *)(plVar16 + 2);
        if ((Module *)*plVar16 == pMVar1) {
          local_130._M_allocated_capacity =
               (size_type)
               (pMVar1->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_130._8_8_ = plVar16[3];
          builder.wasm = (Module *)&local_130;
        }
        else {
          local_130._M_allocated_capacity =
               (size_type)
               (pMVar1->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          builder.wasm = (Module *)*plVar16;
        }
        *plVar16 = (long)pMVar1;
        plVar16[1] = 0;
        *(undefined1 *)
         &(pMVar1->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((Function *)local_80._0_8_ != (Function *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        if (wrappedExports._M_h._M_single_bucket != local_90) {
          operator_delete(wrappedExports._M_h._M_single_bucket,
                          (ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_190,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&stateChangingImports.field_2 + 8));
        pbVar13 = local_190.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar35 = local_190.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_190.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar24 = local_190.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar15 = true;
        while ((bVar35 && (bVar35 = String::wildcardMatch(psVar24,(string *)&builder), !bVar35))) {
          psVar24 = psVar24 + 1;
          bVar35 = psVar24 != pbVar13;
          bVar15 = bVar35;
        }
      }
      if ((pcVar5 != (char *)0x0) &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_190),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)builder.wasm != &local_130)) {
        operator_delete(builder.wasm,(ulong)(local_130._M_allocated_capacity + 1));
      }
      if (bVar15) {
        makeWrapperForImport
                  (this,(Function *)
                        originalFunctions.
                        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_60,(Name)local_118,
                   SUB81(local_120,0));
      }
      _Var31._M_head_impl =
           (Function *)
           &((_Var31._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str;
    } while (_Var31._M_head_impl != (Function *)ppFVar14);
  }
  if (_Stack_108._M_head_impl != (Function *)0x0) {
    operator_delete(_Stack_108._M_head_impl,
                    (long)originalFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)_Stack_108._M_head_impl)
    ;
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_230);
  if ((size_type *)listedImports._24_8_ != &stateChangingExports._M_string_length) {
    operator_delete((void *)listedImports._24_8_,stateChangingExports._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&stateChangingImports.field_2 + 8));
  if ((size_type *)listedExports._24_8_ != &stateChangingImports._M_string_length) {
    operator_delete((void *)listedExports._24_8_,stateChangingImports._M_string_length + 1);
  }
  return;
}

Assistant:

void run(Module* module) override {
    Builder builder(*module);

    // Find which imports can suspend.
    auto stateChangingImports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-imports", "")));
    String::Split listedImports(stateChangingImports, ",");

    // Find which exports should create a promise.
    auto stateChangingExports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-exports", "")));
    String::Split listedExports(stateChangingExports, ",");

    bool wasmSplit = hasArgument("jspi-split-module");
    if (wasmSplit) {
      // Make an import for the load secondary module function so a JSPI wrapper
      // version will be created.
      auto import =
        Builder::makeFunction(ModuleSplitting::LOAD_SECONDARY_MODULE,
                              Signature(Type::none, Type::none),
                              {});
      import->module = ENV;
      import->base = ModuleSplitting::LOAD_SECONDARY_MODULE;
      module->addFunction(std::move(import));
      listedImports.push_back(
        ENV.toString() + "." +
        ModuleSplitting::LOAD_SECONDARY_MODULE.toString());
    }

    // Create a global to store the suspender that is passed into exported
    // functions and will then need to be passed out to the imported functions.
    Name suspender = Names::getValidGlobalName(*module, "suspender");
    module->addGlobal(builder.makeGlobal(suspender,
                                         externref,
                                         builder.makeRefNull(HeapType::noext),
                                         Builder::Mutable));

    // Keep track of already wrapped functions since they can be exported
    // multiple times, but only one wrapper is needed.
    std::unordered_map<Name, Name> wrappedExports;

    // Wrap each exported function in a function that stores the suspender
    // and calls the original export.
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function &&
          canChangeState(ex->name.toString(), listedExports)) {
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        Name wrapperName;
        auto iter = wrappedExports.find(func->name);
        if (iter == wrappedExports.end()) {
          wrapperName = makeWrapperForExport(func, module, suspender);
          wrappedExports[func->name] = wrapperName;
        } else {
          wrapperName = iter->second;
        }
        *name = wrapperName;
      }
    }

    // Replace any references to the original exports that are in the elements.
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); i++) {
        if (auto* get = segment->data[i]->dynCast<RefFunc>()) {
          auto iter = wrappedExports.find(get->func);
          if (iter == wrappedExports.end()) {
            continue;
          }
          auto* replacementRef = builder.makeRefFunc(
            iter->second, module->getFunction(iter->second)->type);
          segment->data[i] = replacementRef;
        }
      }
    }

    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // Wrap each imported function in a function that gets the global suspender
    // and passes it on to the imported function.
    for (auto* im : originalFunctions) {
      if (im->imported() &&
          canChangeState(getFullFunctionName(im->module, im->base),
                         listedImports)) {
        makeWrapperForImport(im, module, suspender, wasmSplit);
      }
    }
  }